

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O0

Dims * __thiscall adios2::core::VariableBase::Shape(VariableBase *this,size_t step)

{
  byte bVar1;
  bool bVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RSI;
  Dims *in_RDI;
  const_iterator it;
  size_t stepInput;
  VariableBase *in_stack_00000060;
  Dims *tmp;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffff48;
  Dims *this_00;
  _Self local_78;
  undefined1 *local_70;
  const_iterator in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Shape",&local_39);
  CheckRandomAccess(in_stack_00000060,stepInput,(string *)it._M_node);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(long *)(in_RSI + 0x120) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9676f2);
    bVar1 = (**(code **)(**(long **)(in_RSI + 0x120) + 0x68))
                      (*(long **)(in_RSI + 0x120),in_RSI,local_18,this_00);
    if ((bVar1 & 1) != 0) {
      return in_RDI;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  }
  if (((*(byte *)(in_RSI + 0xd3) & 1) == 0) ||
     (local_18 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xffffffffffffffff)) {
    if ((*(long *)(in_RSI + 0x120) != 0) && (*(int *)(in_RSI + 0x40) == 2)) {
      if ((*(byte *)(in_RSI + 0xd3) & 1) == 0) {
        local_18 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (**(code **)(**(long **)(in_RSI + 0x120) + 0x20))();
      }
      local_70 = (undefined1 *)
                 ((long)&(local_18->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
      in_stack_ffffffffffffffa0 = local_18;
      in_stack_ffffffffffffff98 =
           std::
           map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::find(in_stack_ffffffffffffff48,(key_type *)0x967869);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::end(in_stack_ffffffffffffff48);
      bVar2 = std::operator!=((_Self *)&stack0xffffffffffffff98,&local_78);
      if (bVar2) {
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)local_18);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (in_stack_ffffffffffffffa0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffff98._M_node);
        return in_RDI;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffa0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff98._M_node);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffa0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff98._M_node);
  }
  return in_RDI;
}

Assistant:

Dims VariableBase::Shape(const size_t step) const
{
    CheckRandomAccess(step, "Shape");

    if (m_Engine)
    {
        Dims tmp;
        // see if the engine implements Variable Shape inquiry
        if (m_Engine->VarShape(*this, step, tmp))
            return tmp;
    }
    if (m_FirstStreamingStep && step == adios2::EngineCurrentStep)
    {
        return m_Shape;
    }

    if (m_Engine != nullptr && m_ShapeID == ShapeID::GlobalArray)
    {
        const size_t stepInput = !m_FirstStreamingStep ? m_Engine->CurrentStep() : step;

        const auto it = m_AvailableShapes.find(stepInput + 1);
        if (it != m_AvailableShapes.end())
        {
            return it->second;
        }
    }
    return m_Shape;
}